

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::PropagateIntRangeBinary
          (GlobOpt *this,Instr *instr,int32 min1,int32 max1,int32 min2,int32 max2,int32 *pNewMin,
          int32 *pNewMax)

{
  code *pcVar1;
  IntConstantBounds IVar2;
  bool bVar3;
  byte bVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint uVar7;
  undefined4 *puVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  IntConstantBounds local_48;
  IntConstantBounds local_40;
  uint local_38;
  uint32 local_34;
  
  uVar7 = 0x80000000;
  uVar13 = 0x7fffffff;
  switch(instr->m_opcode) {
  case And_A:
    if (min2 != -0x80000000 || min1 != -0x80000000) {
      uVar7 = max1;
      if ((uint)max1 < (uint)min1) {
        uVar7 = min1;
      }
      uVar13 = max2;
      if ((uint)max2 < (uint)min2) {
        uVar13 = min2;
      }
      if (uVar7 < uVar13) {
        min2 = min1;
        max2 = max1;
      }
      if ((uint)max2 < (uint)min2) {
        max2 = min2;
      }
      if (0x7ffffffe < (uint)max2) {
        max2 = 0x7fffffff;
      }
      uVar13 = max2;
      uVar7 = min2 & 0x80000000;
    }
    break;
  case Or_A:
  case Xor_A:
    if ((uint)max1 < (uint)min1) {
      max1 = min1;
    }
    if ((uint)max2 < (uint)min2) {
      max2 = min2;
    }
    if ((uint)max2 < (uint)max1) {
      max2 = max1;
    }
    if (max2 < 0) break;
    uVar5 = Math::Log2(max2);
    uVar13 = (2 << ((byte)uVar5 & 0x1f)) - 1;
    goto LAB_0042e0a9;
  case Shl_A:
    bVar3 = 0x1f < (uint)(max2 | min2);
    uVar10 = max2 & 0x1f;
    if (bVar3 && min2 != max2) {
      uVar10 = 0x1f;
    }
    local_38 = 0;
    if (!bVar3 || min2 == max2) {
      local_38 = min2 & 0x1f;
    }
    iVar14 = 0x20;
    if (min1 != 0) {
      uVar5 = Math::Log2(min1);
      iVar14 = 0x1f - uVar5;
    }
    iVar12 = 0x20;
    local_40.lowerBound = min1;
    if (max1 != 0) {
      local_34 = max1;
      uVar5 = Math::Log2(max1);
      iVar12 = 0x1f - uVar5;
      max1 = local_34;
    }
    if ((iVar14 <= (int)uVar10) || (iVar12 <= (int)uVar10)) break;
    uVar5 = 0;
    iVar14 = 0;
    if (local_40.lowerBound != 0) {
      uVar6 = Math::Log2(local_40.lowerBound);
      iVar14 = (2 << ((byte)uVar6 & 0x1f)) + -1;
    }
    if (max1 == 0) {
LAB_0042e5db:
      uVar13 = uVar5 << ((byte)local_38 & 0x1f) & 0x7fffffff;
    }
    else {
      uVar5 = Math::Log2(max1);
      uVar5 = (2 << ((byte)uVar5 & 0x1f)) - 1;
      if ((int)uVar5 < 1) goto LAB_0042e5db;
      uVar6 = Math::Log2(uVar5);
      uVar7 = 0x1e;
      if (uVar10 < 0x1e) {
        uVar7 = uVar10;
      }
      uVar13 = 0x7fffffff;
      if ((int)uVar7 <= (int)(0x20 - uVar6)) {
        uVar7 = uVar5 << (sbyte)uVar7 & 0x7fffffff;
        uVar13 = iVar14 << ((byte)local_38 & 0x1f) & 0x7fffffff;
        if (uVar13 < uVar7) {
          uVar13 = uVar7;
        }
      }
    }
    uVar5 = uVar5 << (sbyte)uVar10;
    uVar7 = local_38;
    if (iVar14 < 0) {
      uVar7 = uVar10;
    }
    uVar6 = iVar14 << ((byte)uVar7 & 0x1f);
    if ((int)uVar5 <= (int)uVar6) {
      uVar6 = uVar5;
    }
    if (uVar6 != 0) {
      uVar5 = Math::Log2(uVar6);
      uVar7 = 1 << ((byte)uVar5 & 0x1f);
      break;
    }
LAB_0042e0a9:
    uVar7 = 0;
    break;
  case Shr_A:
    bVar3 = (uint)(max2 | min2) < 0x20;
    bVar9 = 0x1f;
    if (bVar3 || min2 == max2) {
      bVar9 = (byte)max2 & 0x1f;
    }
    bVar4 = 0;
    if (bVar3 || min2 == max2) {
      bVar4 = (byte)min2 & 0x1f;
    }
    uVar13 = (uint)max1 >> bVar4;
    if (max1 < 0) {
      uVar13 = max1 >> bVar9;
    }
    if (min1 < 0) {
      uVar7 = min1 >> bVar4;
    }
    else {
      uVar7 = (uint)min1 >> bVar9;
    }
    break;
  case ShrU_A:
    if ((max2 & 0x1fU) == 0 && min2 == max2) {
      uVar13 = max1;
      uVar7 = min1;
      if ((min1 < 0) && ((*(ushort *)&instr->field_0x36 & 0x80) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1824,"(instr->ignoreIntOverflow || min1 >= 0)",
                           "instr->ignoreIntOverflow || min1 >= 0");
        if (!bVar3) {
LAB_0042e665:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar8 = 0;
      }
    }
    else {
      local_34 = max1;
      IntConstantBounds::IntConstantBounds(&local_48,min2,max2);
      local_40 = IntConstantBounds::And_0x1f(&local_48);
      if (((min1 < 0) && ((instr->field_0x36 & 0x80) == 0)) &&
         (-1 < (long)local_40 && local_40.lowerBound < 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x182d,
                           "(min1 >= 0 || instr->ignoreIntOverflow || !src2NewBounds.Contains(0))",
                           "min1 >= 0 || instr->ignoreIntOverflow || !src2NewBounds.Contains(0)");
        if (!bVar3) goto LAB_0042e665;
        *puVar8 = 0;
      }
      IVar2 = local_40;
      iVar14 = local_40.upperBound;
      if (iVar14 < local_40.lowerBound) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1831,"(min2 <= max2)","min2 <= max2");
        if (!bVar3) goto LAB_0042e665;
        *puVar8 = 0;
      }
      iVar12 = local_40.lowerBound;
      if (((iVar12 < 1) && (min1 < 0)) && ((*(ushort *)&instr->field_0x36 & 0x80) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1833,"(min2 > 0 || instr->ignoreIntOverflow || min1 >= 0)",
                           "min2 > 0 || instr->ignoreIntOverflow || min1 >= 0");
        if (!bVar3) goto LAB_0042e665;
        *puVar8 = 0;
        iVar12 = local_40.lowerBound;
      }
      uVar5 = local_34;
      if ((uint)min1 < local_34) {
        uVar5 = min1;
      }
      uVar10 = local_34;
      if (local_34 < (uint)min1) {
        uVar10 = min1;
      }
      if (iVar12 < 0 || 0x1f < iVar14) {
        AssertCount = AssertCount + 1;
        local_38 = uVar10;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x183f,"(min2 >= 0 && max2 < 32)","min2 >= 0 && max2 < 32");
        if (!bVar3) goto LAB_0042e665;
        *puVar8 = 0;
        iVar12 = local_40.lowerBound;
        uVar10 = local_38;
      }
      uVar11 = uVar5 >> ((byte)IVar2.upperBound & 0x1f);
      uVar7 = 0;
      if ((int)local_34 < 0) {
        uVar7 = uVar11;
      }
      uVar13 = 0xffffffff;
      if (-1 < min1) {
        uVar13 = uVar10;
      }
      if (0 < min1) {
        uVar7 = uVar11;
      }
      uVar13 = uVar13 >> ((byte)iVar12 & 0x1f);
      if (((instr->field_0x36 & 0x80) == 0) && ((int)(uVar7 | uVar13) < 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1855,"(instr->ignoreIntOverflow || (min >= 0 && max >= 0))",
                           "instr->ignoreIntOverflow || (min >= 0 && max >= 0)");
        if (!bVar3) goto LAB_0042e665;
        *puVar8 = 0;
        iVar12 = local_40.lowerBound;
      }
      if ((int)uVar13 < (int)uVar7) {
        if ((iVar12 != 0) || ((min1 < 0 && ((*(ushort *)&instr->field_0x36 & 0x80) == 0)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x1859,"(min2 == 0 && (instr->ignoreIntOverflow || min1 >= 0))",
                             "min2 == 0 && (instr->ignoreIntOverflow || min1 >= 0)");
          if (!bVar3) goto LAB_0042e665;
          *puVar8 = 0;
        }
        uVar13 = 0x7fffffff;
        uVar7 = 0x80000000;
      }
    }
  }
  *pNewMin = uVar7;
  *pNewMax = uVar13;
  return;
}

Assistant:

void
GlobOpt::PropagateIntRangeBinary(IR::Instr *instr, int32 min1, int32 max1,
    int32 min2, int32 max2, int32 *pNewMin, int32* pNewMax)
{
    int32 min, max, tmp, tmp2;

    min = INT32_MIN;
    max = INT32_MAX;

    switch (instr->m_opcode)
    {
    case Js::OpCode::Xor_A:
    case Js::OpCode::Or_A:
        // Find range with highest high order bit
        tmp = ::max((uint32)min1, (uint32)max1);
        tmp2 = ::max((uint32)min2, (uint32)max2);

        if ((uint32)tmp > (uint32)tmp2)
        {
            max = tmp;
        }
        else
        {
            max = tmp2;
        }

        if (max < 0)
        {
            min = INT32_MIN;  // REVIEW: conservative...
            max = INT32_MAX;
        }
        else
        {
            // Turn values like 0x1010 into 0x1111
            max = 1 << Math::Log2(max);
            max = (uint32)(max << 1) - 1;
            min = 0;
        }

        break;

    case Js::OpCode::And_A:

        if (min1 == INT32_MIN && min2 == INT32_MIN)
        {
            // Shortcut
            break;
        }

        // Find range with lowest higher bit
        tmp = ::max((uint32)min1, (uint32)max1);
        tmp2 = ::max((uint32)min2, (uint32)max2);

        if ((uint32)tmp < (uint32)tmp2)
        {
            min = min1;
            max = max1;
        }
        else
        {
            min = min2;
            max = max2;
        }

        // To compute max, look if min has higher high bit
        if ((uint32)min > (uint32)max)
        {
            max = min;
        }

        // If max is negative, max let's assume it could be -1, so result in MAX_INT
        if (max < 0)
        {
            max = INT32_MAX;
        }

        // If min is positive, the resulting min is zero
        if (min >= 0)
        {
            min = 0;
        }
        else
        {
            min = INT32_MIN;
        }
        break;

    case Js::OpCode::Shl_A:
        {
            // Shift count
            if (min2 != max2 && ((uint32)min2 > 0x1F || (uint32)max2 > 0x1F))
            {
                min2 = 0;
                max2 = 0x1F;
            }
            else
            {
                min2 &= 0x1F;
                max2 &= 0x1F;
            }

            int32 min1FreeTopBitCount = min1 ? (sizeof(int32) * 8) - (Math::Log2(min1) + 1) : (sizeof(int32) * 8);
            int32 max1FreeTopBitCount = max1 ? (sizeof(int32) * 8) - (Math::Log2(max1) + 1) : (sizeof(int32) * 8);
            if (min1FreeTopBitCount <= max2 || max1FreeTopBitCount <= max2)
            {
                // If the shift is going to touch the sign bit return the max range
                min = INT32_MIN;
                max = INT32_MAX;
            }
            else
            {
                // Compute max
                // Turn values like 0x1010 into 0x1111
                if (min1)
                {
                    min1 = 1 << Math::Log2(min1);
                    min1 = (min1 << 1) - 1;
                }
                if (max1)
                {
                    max1 = 1 << Math::Log2(max1);
                    max1 = (uint32)(max1 << 1) - 1;
                }

                if (max1 > 0)
                {
                    int32 nrTopBits = (sizeof(int32) * 8) - Math::Log2(max1);
                    if (nrTopBits < ::min(max2, 30))
                        max = INT32_MAX;
                    else
                        max = ::max((max1 << ::min(max2, 30)) & ~0x80000000, (min1 << min2) & ~0x80000000);
                }
                else
                {
                    max = (max1 << min2) & ~0x80000000;
                }
                // Compute min

                if (min1 < 0)
                {
                    min = ::min(min1 << max2, max1 << max2);
                }
                else
                {
                    min = ::min(min1 << min2, max1 << max2);
                }
                // Turn values like 0x1110 into 0x1000
                if (min)
                {
                    min = 1 << Math::Log2(min);
                }
            }
        }
        break;

    case Js::OpCode::Shr_A:
        // Shift count
        if (min2 != max2 && ((uint32)min2 > 0x1F || (uint32)max2 > 0x1F))
        {
            min2 = 0;
            max2 = 0x1F;
        }
        else
        {
            min2 &= 0x1F;
            max2 &= 0x1F;
        }

        // Compute max

        if (max1 < 0)
        {
            max = max1 >> max2;
        }
        else
        {
            max = max1 >> min2;
        }

        // Compute min

        if (min1 < 0)
        {
            min = min1 >> min2;
        }
        else
        {
            min = min1 >> max2;
        }
        break;

    case Js::OpCode::ShrU_A:

        // shift count is constant zero
        if ((min2 == max2) && (max2 & 0x1f) == 0)
        {
            // We can't encode uint32 result, so it has to be used as int32 only or the original value is positive.
            Assert(instr->ignoreIntOverflow || min1 >= 0);
            // We can transfer the signed int32 range.
            min = min1;
            max = max1;
            break;
        }

        const IntConstantBounds src2NewBounds = IntConstantBounds(min2, max2).And_0x1f();
        // Zero is only allowed if result is always a signed int32 or always used as a signed int32
        Assert(min1 >= 0 || instr->ignoreIntOverflow || !src2NewBounds.Contains(0));
        min2 = src2NewBounds.LowerBound();
        max2 = src2NewBounds.UpperBound();

        Assert(min2 <= max2);
        // zero shift count is only allowed if result is used as int32 and/or value is positive
        Assert(min2 > 0 || instr->ignoreIntOverflow || min1 >= 0);

        uint32 umin1 = (uint32)min1;
        uint32 umax1 = (uint32)max1;

        if (umin1 > umax1)
        {
            uint32 temp = umax1;
            umax1 = umin1;
            umin1 = temp;
        }

        Assert(min2 >= 0 && max2 < 32);

        // Compute max

        if (min1 < 0)
        {
            umax1 = UINT32_MAX;
        }
        max = umax1 >> min2;

        // Compute min

        if (min1 <= 0 && max1 >=0)
        {
            min = 0;
        }
        else
        {
            min = umin1 >> max2;
        }

        // We should be able to fit uint32 range as int32
        Assert(instr->ignoreIntOverflow || (min >= 0 && max >= 0) );
        if (min > max)
        {
            // can only happen if shift count can be zero
            Assert(min2 == 0 && (instr->ignoreIntOverflow || min1 >= 0));
            min = Int32ConstMin;
            max = Int32ConstMax;
        }

        break;
    }

    *pNewMin = min;
    *pNewMax = max;
}